

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void DeserializeHDKeypath<DataStream>(DataStream *s,KeyOriginInfo *hd_keypath)

{
  uint64_t length;
  long in_FS_OFFSET;
  KeyOriginInfo local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  length = ReadCompactSize<DataStream>(s,true);
  DeserializeKeyOrigin<DataStream>(&local_40,s,length);
  *&hd_keypath->fingerprint = local_40.fingerprint;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&hd_keypath->path,&local_40.path);
  if (local_40.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeHDKeypath(Stream& s, KeyOriginInfo& hd_keypath)
{
    hd_keypath = DeserializeKeyOrigin(s, ReadCompactSize(s));
}